

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_cubic_interpolation.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  Scalar *pSVar2;
  ulong uVar3;
  size_type sVar4;
  reference a;
  reference b;
  ostream *poVar5;
  void *pvVar6;
  reference other;
  __type _Var7;
  double dVar8;
  _InputArray local_2c8;
  allocator<char> local_2a9;
  string local_2a8 [32];
  Scalar_<double> local_288;
  Point_<int> local_268;
  _InputOutputArray local_260;
  undefined1 local_248 [8];
  Matrix<double,_2,_1,_0,_2,_1> p_2;
  __normal_iterator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_230;
  iterator __end1;
  iterator __begin1;
  double local_218;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_210;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *local_1f8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *__range1;
  int local_1e8;
  Point_<int> p_1;
  int i;
  double acc_length;
  _InputArray local_1b8;
  _InputOutputArray local_1a0;
  int local_184;
  int local_180 [5];
  undefined4 local_16c;
  undefined1 local_168 [8];
  PointType p;
  double step;
  double t;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  Mat local_108 [8];
  Mat img;
  int local_a0;
  int width;
  PointType local_98;
  int local_80 [2];
  PointType local_78;
  undefined1 local_68 [8];
  CubicInterpolation cubic;
  
  CubicInterpolation::CubicInterpolation((CubicInterpolation *)local_68);
  local_80[1] = 100;
  local_80[0] = 100;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)&local_78,local_80 + 1,local_80);
  width = 300;
  local_a0 = 300;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)&local_98,&width,&local_a0);
  CubicInterpolation::interpolation((CubicInterpolation *)local_68,&local_78,0.0,&local_98,0.0);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)
             &vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0);
  cv::Mat::Mat(local_108,400,400,0x10,
               (Scalar_ *)
               &vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
  for (step = 0.0; step <= 1.0; step = step + 0.01) {
    local_16c = 0;
    CubicInterpolation::at((CubicInterpolation *)local_168,(double *)local_68,(int *)&step);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_168,0);
    local_180[0] = (int)*pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_168,1);
    local_184 = (int)*pSVar2;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&t,local_180,&local_184);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_1a0,local_108);
  cv::_InputArray::_InputArray<cv::Point_<int>>
            (&local_1b8,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&acc_length,0.0,0.0,255.0,0.0);
  cv::polylines(&local_1a0,&local_1b8,false,(Scalar_ *)&acc_length,1,0x10,0);
  cv::_InputArray::~_InputArray(&local_1b8);
  cv::_InputOutputArray::~_InputOutputArray(&local_1a0);
  stack0xfffffffffffffe20 = 0.0;
  p_1.x = 1;
  while( true ) {
    uVar3 = (ulong)p_1.x;
    sVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
    if (sVar4 <= uVar3) break;
    a = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t,(long)p_1.x);
    b = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t,
                   (long)(p_1.x + -1));
    cv::operator-((cv *)((long)&__range1 + 4),a,b);
    _Var7 = std::sqrt<int>(__range1._4_4_ * __range1._4_4_ + local_1e8 * local_1e8);
    register0x00001200 = _Var7 + stack0xfffffffffffffe20;
    p_1.x = p_1.x + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"naive length: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,stack0xfffffffffffffe20);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"length: ");
  dVar8 = Curve<3,_2>::length((Curve<3,_2> *)local_68);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar8);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  local_218 = 20.0;
  __begin1._M_current._4_4_ = 4;
  Curve<3,_2>::sampleWithArcLengthParameterized
            (&local_210,(Curve<3,_2> *)local_68,&local_218,true,
             (int *)((long)&__begin1._M_current + 4),(vector<double,_std::allocator<double>_> *)0x0)
  ;
  local_1f8 = &local_210;
  __end1 = std::
           vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           ::begin(local_1f8);
  local_230._M_current =
       (Matrix<double,_2,_1,_0,_2,_1> *)
       std::
       vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ::end(local_1f8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_230);
    if (!bVar1) break;
    other = __gnu_cxx::
            __normal_iterator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
            ::operator*(&__end1);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_248,other);
    cv::_InputOutputArray::_InputOutputArray(&local_260,local_108);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_248);
    dVar8 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_248);
    cv::Point_<int>::Point_(&local_268,(int)dVar8,(int)*pSVar2);
    cv::Scalar_<double>::Scalar_(&local_288,255.0,255.0,255.0,0.0);
    cv::circle(&local_260,&local_268,4,&local_288,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_260);
    __gnu_cxx::
    __normal_iterator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::~vector(&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"Cubic Interpolation",&local_2a9);
  cv::_InputArray::_InputArray(&local_2c8,local_108);
  cv::imshow(local_2a8,&local_2c8);
  cv::_InputArray::~_InputArray(&local_2c8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  cv::waitKey(0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
  cv::Mat::~Mat(local_108);
  return 0;
}

Assistant:

int main() {
  // fit a cubic spline
  CubicInterpolation cubic;
  cubic.interpolation({100, 100}, 0, {300, 300}, 0);

  int width = 400;
  Mat img(width, width, CV_8UC3, Scalar(0));

  vector<Point> vec;
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto p = cubic.at(t);
    vec.emplace_back(int(p[0]), int(p[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);
  double acc_length = 0;
  for (int i = 1; i < vec.size(); ++i) {
    auto p = (vec[i] - vec[i - 1]);
    acc_length += sqrt(p.x * p.x + p.y * p.y);
  }
  cout << "naive length: " << acc_length << endl;
  cout << "length: " << cubic.length() << endl;

  // Uniform sampling
  for (auto p : cubic.sampleWithArcLengthParameterized(20)) {
    cv::circle(img, {int(p.x()), int(p.y())}, 4, {255, 255, 255}, 1);
  }

  imshow("Cubic Interpolation", img);
  waitKey(0);

  return 0;
}